

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QXdgDesktopPortalFileDialog::Filter>::Inserter::insert
          (Inserter *this,qsizetype pos,Filter *t,qsizetype n)

{
  QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *this_00;
  undefined8 *puVar1;
  Filter *pFVar2;
  Data *pDVar3;
  Data *pDVar4;
  undefined8 uVar5;
  qsizetype qVar6;
  undefined8 uVar7;
  FilterCondition *pFVar8;
  FilterCondition *pFVar9;
  qsizetype i;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined8 *puVar13;
  
  pFVar2 = this->begin;
  lVar10 = this->size;
  this->end = pFVar2 + lVar10;
  this->last = pFVar2 + lVar10 + -1;
  this->where = pFVar2 + pos;
  lVar10 = lVar10 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = n;
  lVar11 = n - lVar10;
  this->move = lVar11;
  this->sourceCopyAssign = n;
  if (lVar11 != 0 && lVar10 <= n) {
    this->sourceCopyConstruct = lVar11;
    this->move = 0;
    this->sourceCopyAssign = lVar10;
  }
  lVar10 = this->sourceCopyConstruct;
  if (lVar10 != 0) {
    lVar11 = 0x28;
    lVar12 = 0;
    do {
      pFVar2 = this->end;
      pDVar3 = (t->name).d.d;
      *(Data **)((long)pFVar2 + lVar11 + -0x28) = pDVar3;
      *(char16_t **)((long)pFVar2 + lVar11 + -0x20) = (t->name).d.ptr;
      *(qsizetype *)((long)pFVar2 + lVar11 + -0x18) = (t->name).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar4 = (t->filterConditions).d.d;
      *(Data **)((long)pFVar2 + lVar11 + -0x10) = pDVar4;
      *(FilterCondition **)((long)pFVar2 + lVar11 + -8) = (t->filterConditions).d.ptr;
      *(qsizetype *)((long)&(pFVar2->name).d.d + lVar11) = (t->filterConditions).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      this->size = this->size + 1;
      lVar12 = lVar12 + 1;
      lVar10 = this->sourceCopyConstruct;
      lVar11 = lVar11 + 0x30;
    } while (lVar12 != lVar10);
  }
  lVar11 = this->nSource;
  if (lVar10 != lVar11) {
    lVar12 = lVar10 * 0x30 + 0x18;
    do {
      pFVar2 = this->end;
      puVar13 = (undefined8 *)((long)&pFVar2[-lVar11].name.d.d + lVar12);
      uVar5 = puVar13[-3];
      uVar7 = puVar13[-2];
      puVar13[-3] = 0;
      puVar13[-2] = 0;
      puVar1 = (undefined8 *)((long)pFVar2 + lVar12 + -0x18);
      *puVar1 = uVar5;
      puVar1[1] = uVar7;
      uVar5 = puVar13[-1];
      puVar13[-1] = 0;
      *(undefined8 *)((long)pFVar2 + lVar12 + -8) = uVar5;
      uVar5 = *puVar13;
      uVar7 = puVar13[1];
      *puVar13 = 0;
      puVar13[1] = 0;
      puVar1 = (undefined8 *)((long)&(pFVar2->name).d.d + lVar12);
      *puVar1 = uVar5;
      puVar1[1] = uVar7;
      uVar5 = puVar13[2];
      puVar13[2] = 0;
      *(undefined8 *)((long)&(pFVar2->name).d.size + lVar12) = uVar5;
      this->size = this->size + 1;
      lVar10 = lVar10 + 1;
      lVar11 = this->nSource;
      lVar12 = lVar12 + 0x30;
    } while (lVar10 != lVar11);
  }
  if (this->move != 0) {
    lVar11 = 0x18;
    lVar10 = 0;
    do {
      lVar12 = this->nSource;
      pFVar2 = this->last;
      this_00 = (QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *)
                ((long)&(pFVar2->name).d.d + lVar11);
      puVar1 = (undefined8 *)((long)pFVar2 + lVar11 + -0x18);
      pDVar4 = (Data *)*puVar1;
      pFVar8 = (FilterCondition *)puVar1[1];
      pFVar9 = this_00[lVar12 * -2 + -1].ptr;
      puVar1 = (undefined8 *)((long)pFVar2 + lVar11 + -0x18);
      *puVar1 = this_00[lVar12 * -2 + -1].d;
      puVar1[1] = pFVar9;
      this_00[lVar12 * -2 + -1].d = pDVar4;
      this_00[lVar12 * -2 + -1].ptr = pFVar8;
      qVar6 = *(qsizetype *)((long)pFVar2 + lVar11 + -8);
      *(qsizetype *)((long)pFVar2 + lVar11 + -8) = this_00[lVar12 * -2 + -1].size;
      this_00[lVar12 * -2 + -1].size = qVar6;
      QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::operator=
                (this_00,(QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *)
                         ((long)&pFVar2[-lVar12].name.d.d + lVar11));
      lVar10 = lVar10 + -1;
      lVar11 = lVar11 + -0x30;
    } while (lVar10 != this->move);
  }
  if (this->sourceCopyAssign != 0) {
    lVar11 = 0x18;
    lVar10 = 0;
    do {
      pFVar2 = this->where;
      QString::operator=((QString *)((long)pFVar2 + lVar11 + -0x18),&t->name);
      QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::operator=
                ((QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *)
                 ((long)&(pFVar2->name).d.d + lVar11),&(t->filterConditions).d);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x30;
    } while (lVar10 != this->sourceCopyAssign);
  }
  return;
}

Assistant:

void insert(qsizetype pos, const T &t, qsizetype n)
        {
            const qsizetype oldSize = size;
            Q_UNUSED(oldSize);

            setup(pos, n);

            // first create new elements at the end, by copying from elements
            // to be inserted (if they extend past the current end of the array)
            for (qsizetype i = 0; i != sourceCopyConstruct; ++i) {
                new (end + i) T(t);
                ++size;
            }
            Q_ASSERT(size <= oldSize + n);

            // now move construct new elements at the end from existing elements inside
            // the array.
            for (qsizetype i = sourceCopyConstruct; i != nSource; ++i) {
                new (end + i) T(std::move(*(end + i - nSource)));
                ++size;
            }
            // array has the new size now!
            Q_ASSERT(size == oldSize + n);

            // now move assign existing elements towards the end
            for (qsizetype i = 0; i != move; --i)
                last[i] = std::move(last[i - nSource]);

            // finally copy the remaining elements from source over
            for (qsizetype i = 0; i != sourceCopyAssign; ++i)
                where[i] = t;
        }